

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

short * __thiscall
sisl::array_n<short,_3,_std::allocator<short>_>::operator()
          (array_n<short,_3,_std::allocator<short>_> *this,uint d0,...)

{
  char in_AL;
  undefined8 *puVar1;
  undefined8 in_RCX;
  long lVar2;
  undefined8 in_RDX;
  ulong uVar3;
  undefined8 in_R8;
  void **ppvVar4;
  ulong uVar5;
  void **ppvVar6;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_d8;
  void *local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  uVar3 = (ulong)d0;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  ppvVar4 = &vl[0].overflow_arg_area;
  if (d0 < this->_dims[0]) {
    local_d8 = 0x10;
    lVar2 = 3;
    while( true ) {
      if (local_d8 < 0x29) {
        uVar5 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        ppvVar6 = (void **)((long)local_b8 + uVar5);
      }
      else {
        ppvVar6 = ppvVar4;
        ppvVar4 = ppvVar4 + 1;
      }
      if (this->_dims[lVar2 + -2] <= *(uint *)ppvVar6) break;
      uVar3 = (ulong)((int)uVar3 * this->_dims[lVar2 + -2] + *(uint *)ppvVar6);
      lVar2 = lVar2 + 1;
      if (lVar2 == 5) {
        return this->_array + uVar3;
      }
    }
  }
  local_b8[2] = (void *)in_RDX;
  local_b8[3] = (void *)in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Index out of bounds!";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            return _array[index];
        }